

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O2

Client __thiscall capnp::TwoPartyClient::bootstrap(TwoPartyClient *this)

{
  Reader vatId_00;
  ClientHook *extraout_RDX;
  long in_RSI;
  Client CVar1;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  Builder vatId;
  MallocMessageBuilder message;
  
  MallocMessageBuilder::MallocMessageBuilder(&message,4,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnp::rpc::twoparty::VatId>(&vatId,&message.super_MessageBuilder);
  *(ushort *)vatId._builder.data = (ushort)(*(short *)(in_RSI + 0x18) != 1);
  capnp::_::StructBuilder::asReader(&vatId._builder);
  vatId_00._reader.capTable = (CapTableReader *)uStack_158;
  vatId_00._reader.segment = (SegmentReader *)local_160;
  vatId_00._reader.data = (void *)local_150;
  vatId_00._reader.pointers = (WirePointer *)uStack_148;
  vatId_00._reader._32_8_ = local_140;
  vatId_00._reader._40_8_ = uStack_138;
  capnp::_::RpcSystemBase::baseBootstrap((RpcSystemBase *)this,vatId_00);
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  CVar1.hook.ptr = extraout_RDX;
  CVar1.hook.disposer = (Disposer *)this;
  return (Client)CVar1.hook;
}

Assistant:

Capability::Client TwoPartyClient::bootstrap() {
  MallocMessageBuilder message(4);
  auto vatId = message.getRoot<rpc::twoparty::VatId>();
  vatId.setSide(network.getSide() == rpc::twoparty::Side::CLIENT
                ? rpc::twoparty::Side::SERVER
                : rpc::twoparty::Side::CLIENT);
  return rpcSystem.bootstrap(vatId);
}